

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

bool __thiscall fasttext::Dictionary::discard(Dictionary *this,int32_t id,real rand)

{
  bool bVar1;
  
  if (id < 0) {
    __assert_fail("id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/dictionary.cc"
                  ,0x83,"bool fasttext::Dictionary::discard(int32_t, real) const");
  }
  if (id < this->nwords_) {
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
        == sup) {
      bVar1 = false;
    }
    else {
      bVar1 = (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[(uint)id] < rand;
    }
    return bVar1;
  }
  __assert_fail("id < nwords_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/dictionary.cc"
                ,0x84,"bool fasttext::Dictionary::discard(int32_t, real) const");
}

Assistant:

bool Dictionary::discard(int32_t id, real rand) const {
	assert(id >= 0);
	assert(id < nwords_);
	if (args_->model == model_name::sup) {
		return false;
	}
	return rand > pdiscard_[id];
}